

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_movem_re(m68k_info *info,int opcode,int size)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  MCInst_setOpcode(info->inst,0x11c);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = opcode;
  (info->extension).operands[0].type = M68K_OP_REG_BITS;
  uVar4 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar5 = 0xaaaa;
  if (uVar4 + 2 <= info->code_len) {
    uVar5 = (uint)(ushort)(*(ushort *)(info->code + uVar4) << 8 |
                          *(ushort *)(info->code + uVar4) >> 8);
  }
  info->pc = info->pc + 2;
  (info->extension).operands[0].register_bits = uVar5;
  get_ea_mode_op(info,(info->extension).operands + 1,info->ir,opcode);
  if ((info->extension).operands[1].address_mode == M68K_AM_REGI_ADDR_PRE_DEC) {
    uVar5 = (info->extension).operands[0].register_bits;
    bVar2 = 0xf;
    if (1 < uVar5) {
      iVar3 = 0x1f;
      uVar6 = uVar5;
      iVar1 = iVar3;
      if (uVar5 != 0) {
        for (; iVar1 = iVar3, uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      do {
        uVar5 = (uVar6 >> 1 & 1) + uVar5 * 2;
        iVar3 = iVar3 + -1;
        uVar6 = uVar6 >> 1;
      } while (iVar3 != 0);
      bVar2 = 0xf - (char)iVar1;
    }
    (info->extension).operands[0].register_bits = uVar5 << (bVar2 & 0x1f) & 0xffff;
  }
  return;
}

Assistant:

static void build_movem_re(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_REG_BITS;
	op0->register_bits = read_imm_16(info);

	get_ea_mode_op(info, op1, info->ir, size);

	if (op1->address_mode == M68K_AM_REGI_ADDR_PRE_DEC)
		op0->register_bits = reverse_bits(op0->register_bits);
}